

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

void MAFSA_automaton_enumerate
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               void *user_data,MAFSA_automaton_string_handler fetcher)

{
  ulong uVar1;
  MAFSA_letter label;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t state;
  ulong uVar5;
  MAFSA_stack_struct local_48;
  
  state = *ma->ptr_nodes;
  uVar5 = 0xffffffffffffffff;
  local_48.buffer = tmp;
  local_48.reserved = sz_tmp;
  for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < sz_l; uVar3 = uVar3 + 1) {
    label = l[uVar4];
    uVar1 = uVar5 + 1;
    if (uVar1 < sz_tmp) {
      tmp[uVar1] = label;
      uVar5 = uVar1;
    }
    uVar2 = MAFSA_delta(ma->ptr_links,state,label);
    if (uVar2 == 0) break;
    state = ma->ptr_nodes[uVar2];
  }
  if (l == (MAFSA_letter *)0x0 || uVar4 == sz_l) {
    local_48.current = uVar5;
    enumerate(ma,state,&local_48,fetcher,user_data);
  }
  return;
}

Assistant:

extern void MAFSA_automaton_enumerate(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, void *user_data, MAFSA_automaton_string_handler fetcher)
{
    uint32_t i;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 1;

    struct MAFSA_stack_struct tmp_stack;

    tmp_stack.buffer   = tmp;
    tmp_stack.reserved = sz_tmp;
    tmp_stack.current  = -1;

    for (i = 0; i < sz_l; ++i)
    {
        MAFSA_letter label = l[i];
        stack_push(&tmp_stack, label);

        if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if ((i == sz_l && where) || 0 == l)
    {
        enumerate(ma, current, &tmp_stack, fetcher, user_data);
    }
}